

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void delete_reopen_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_config *pfVar4;
  uint uVar5;
  ulong unaff_RBP;
  char *pcVar6;
  fdb_file_handle **ptr_fhandle;
  ulong uVar7;
  fdb_doc *unaff_R14;
  char *kvs_config;
  fdb_file_handle *fh;
  fdb_kvs_handle *db;
  size_t valueSize;
  void *value;
  timeval __test_begin;
  fdb_doc *pfStack_1418;
  fdb_kvs_handle *pfStack_1410;
  fdb_file_handle *pfStack_1408;
  timeval tStack_1400;
  fdb_kvs_config fStack_13f0;
  fdb_config fStack_13d8;
  char acStack_12e0 [256];
  char *pcStack_11e0;
  fdb_config *pfStack_11d8;
  fdb_config *pfStack_11d0;
  fdb_file_handle *pfStack_11c0;
  fdb_kvs_handle *pfStack_11b8;
  fdb_kvs_config fStack_11b0;
  timeval tStack_1198;
  char acStack_1188 [264];
  fdb_config fStack_1080;
  char acStack_f88 [256];
  char acStack_e88 [264];
  char *pcStack_d80;
  fdb_file_handle **ppfStack_d78;
  fdb_config *pfStack_d68;
  fdb_kvs_config *pfStack_d60;
  code *pcStack_d58;
  fdb_kvs_handle *pfStack_d40;
  fdb_file_handle *pfStack_d38;
  fdb_iterator *pfStack_d30;
  timeval tStack_d28;
  fdb_kvs_config fStack_d18;
  fdb_file_handle *apfStack_d00 [32];
  fdb_config fStack_c00;
  fdb_config fStack_af8;
  char acStack_a00 [264];
  fdb_config *pfStack_8f8;
  fdb_file_handle *pfStack_8c0;
  fdb_kvs_handle *pfStack_8b8;
  fdb_doc *pfStack_8b0;
  fdb_doc fStack_8a8;
  fdb_kvs_config fStack_858;
  timeval tStack_840;
  undefined1 auStack_830 [72];
  fdb_config fStack_7e8;
  char acStack_6e8 [256];
  fdb_config fStack_5e8;
  fdb_config *pfStack_4f0;
  fdb_doc *pfStack_4e8;
  fdb_doc *pfStack_4d8;
  fdb_kvs_handle *pfStack_4d0;
  fdb_file_handle *pfStack_4c8;
  fdb_doc fStack_4c0;
  fdb_kvs_config fStack_468;
  timeval tStack_450;
  uint8_t auStack_440 [256];
  fdb_config fStack_340;
  fdb_config fStack_240;
  fdb_config *pfStack_148;
  fdb_file_handle *local_130;
  fdb_kvs_handle *local_128;
  size_t local_120;
  int *local_118;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  local_100.buffercache_size = 0;
  local_100.num_compactor_threads = 1;
  fVar2 = fdb_open(&local_130,"./dummy3",&local_100);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(local_130,&local_128,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058e;
    fVar2 = fdb_begin_transaction(local_130,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110593;
    fVar2 = fdb_set_kv(local_128,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110598;
    fVar2 = fdb_end_transaction(local_130,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059d;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a2;
    if (local_120 != 5) {
      delete_reopen_test();
    }
    if ((char)local_118[1] != 'e' || *local_118 != 0x756c6176) goto LAB_001105a7;
    fdb_free_block(local_118);
    fVar2 = fdb_begin_transaction(local_130,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ac;
    fVar2 = fdb_del_kv(local_128,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b1;
    fVar2 = fdb_end_transaction(local_130,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b6;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105bb;
    fVar2 = fdb_close(local_130);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c0;
    fVar2 = fdb_open(&local_130,"./dummy3",&local_100);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c5;
    fVar2 = fdb_kvs_open_default(local_130,&local_128,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ca;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105cf;
    fVar2 = fdb_close(local_130);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    delete_reopen_test();
LAB_0011058e:
    delete_reopen_test();
LAB_00110593:
    delete_reopen_test();
LAB_00110598:
    delete_reopen_test();
LAB_0011059d:
    delete_reopen_test();
LAB_001105a2:
    delete_reopen_test();
LAB_001105a7:
    delete_reopen_test();
LAB_001105ac:
    delete_reopen_test();
LAB_001105b1:
    delete_reopen_test();
LAB_001105b6:
    delete_reopen_test();
LAB_001105bb:
    delete_reopen_test();
LAB_001105c0:
    delete_reopen_test();
LAB_001105c5:
    delete_reopen_test();
LAB_001105ca:
    delete_reopen_test();
LAB_001105cf:
    delete_reopen_test();
  }
  delete_reopen_test();
  pfStack_4e8 = (fdb_doc *)0x1105f2;
  pfStack_148 = &local_100;
  gettimeofday(&tStack_450,(__timezone_ptr_t)0x0);
  pfStack_4e8 = (fdb_doc *)0x1105f7;
  memleak_start();
  pfStack_4e8 = (fdb_doc *)0x110603;
  system("rm -rf  dummy* > errorlog.txt");
  fStack_4c0.deleted = false;
  fStack_4c0._73_3_ = 0;
  fStack_4c0.flags = 0;
  fStack_4c0.keylen = 0;
  fStack_4c0.metalen = 0;
  fStack_4c0.bodylen = 0;
  fStack_4c0.size_ondisk = 0;
  fStack_4c0.offset = 0;
  fStack_4c0.meta = (void *)0x0;
  fStack_4c0.key = auStack_440;
  fStack_4c0.body = &fStack_340;
  fStack_4c0.seqnum = 0xffffffffffffffff;
  pfVar4 = &fStack_240;
  pfStack_4e8 = (fdb_doc *)0x110652;
  fdb_get_default_config();
  fStack_240.purging_interval = 1;
  fStack_240.seqtree_opt = '\x01';
  pfStack_4e8 = (fdb_doc *)0x110667;
  fdb_get_default_kvs_config();
  pfStack_4e8 = (fdb_doc *)0x11067b;
  fVar2 = fdb_open(&pfStack_4c8,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4e8 = (fdb_doc *)0x110699;
    fVar2 = fdb_kvs_open(pfStack_4c8,&pfStack_4d0,(char *)0x0,&fStack_468);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c4;
    builtin_memcpy(auStack_440,"key",4);
    pfVar4 = &fStack_340;
    fStack_340.chunksize = 0x6f62;
    fStack_340._2_2_ = 0x7964;
    fStack_340.blocksize._0_1_ = 0;
    pfStack_4e8 = (fdb_doc *)0x1106c6;
    fStack_4c0.keylen = strlen((char *)auStack_440);
    unaff_R14 = &fStack_4c0;
    pfStack_4e8 = (fdb_doc *)0x1106d6;
    fStack_4c0.bodylen = strlen((char *)pfVar4);
    pfStack_4e8 = (fdb_doc *)0x1106e7;
    fVar2 = fdb_set(pfStack_4d0,unaff_R14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c9;
    pfStack_4e8 = (fdb_doc *)0x1106fe;
    fVar2 = fdb_commit(pfStack_4c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    pfStack_4e8 = (fdb_doc *)0x110715;
    fVar2 = fdb_del(pfStack_4d0,&fStack_4c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d3;
    pfStack_4e8 = (fdb_doc *)0x11072c;
    fVar2 = fdb_commit(pfStack_4c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pfVar4 = (fdb_config *)&pfStack_4d8;
    pfStack_4e8 = (fdb_doc *)0x11075e;
    fdb_doc_create((fdb_doc **)pfVar4,auStack_440,fStack_4c0.keylen,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e8 = (fdb_doc *)0x11076b;
    fVar2 = fdb_get_metaonly(pfStack_4d0,pfStack_4d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    if (pfStack_4d8->deleted == false) {
      pfStack_4e8 = (fdb_doc *)0x110788;
      deleted_doc_get_api_test();
    }
    pfStack_4d8->deleted = false;
    pfStack_4e8 = (fdb_doc *)0x11079b;
    fVar2 = fdb_get_metaonly_byseq(pfStack_4d0,pfStack_4d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e2;
    if (pfStack_4d8->deleted == false) {
      pfStack_4e8 = (fdb_doc *)0x1107b8;
      deleted_doc_get_api_test();
    }
    pfStack_4d8->deleted = false;
    pfStack_4e8 = (fdb_doc *)0x1107cb;
    fVar2 = fdb_get_byoffset(pfStack_4d0,pfStack_4d8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108e7;
    if (pfStack_4d8->deleted == false) {
      pfStack_4e8 = (fdb_doc *)0x1107e9;
      deleted_doc_get_api_test();
    }
    pfStack_4d8->deleted = false;
    pfStack_4e8 = (fdb_doc *)0x1107fc;
    fVar2 = fdb_get(pfStack_4d0,pfStack_4d8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ec;
    if (pfStack_4d8->deleted == true) {
      pfStack_4e8 = (fdb_doc *)0x11081a;
      deleted_doc_get_api_test();
    }
    pfStack_4d8->deleted = false;
    pfStack_4e8 = (fdb_doc *)0x11082d;
    fVar2 = fdb_get_byseq(pfStack_4d0,pfStack_4d8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f1;
    if (pfStack_4d8->deleted == true) {
      pfStack_4e8 = (fdb_doc *)0x11084b;
      deleted_doc_get_api_test();
    }
    pfStack_4e8 = (fdb_doc *)0x110855;
    fdb_doc_free(pfStack_4d8);
    pfStack_4e8 = (fdb_doc *)0x11085f;
    fVar2 = fdb_kvs_close(pfStack_4d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f6;
    pfStack_4e8 = (fdb_doc *)0x110871;
    fVar2 = fdb_close(pfStack_4c8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4e8 = (fdb_doc *)0x11087e;
      fdb_shutdown();
      pfStack_4e8 = (fdb_doc *)0x110883;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_4e8 = (fdb_doc *)0x1108b4;
      fprintf(_stderr,pcVar6,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_4e8 = (fdb_doc *)0x1108c4;
    deleted_doc_get_api_test();
LAB_001108c4:
    pfStack_4e8 = (fdb_doc *)0x1108c9;
    deleted_doc_get_api_test();
LAB_001108c9:
    pfStack_4e8 = (fdb_doc *)0x1108ce;
    deleted_doc_get_api_test();
LAB_001108ce:
    pfStack_4e8 = (fdb_doc *)0x1108d3;
    deleted_doc_get_api_test();
LAB_001108d3:
    pfStack_4e8 = (fdb_doc *)0x1108d8;
    deleted_doc_get_api_test();
LAB_001108d8:
    pfStack_4e8 = (fdb_doc *)0x1108dd;
    deleted_doc_get_api_test();
LAB_001108dd:
    pfStack_4e8 = (fdb_doc *)0x1108e2;
    deleted_doc_get_api_test();
LAB_001108e2:
    pfStack_4e8 = (fdb_doc *)0x1108e7;
    deleted_doc_get_api_test();
LAB_001108e7:
    pfStack_4e8 = (fdb_doc *)0x1108ec;
    deleted_doc_get_api_test();
LAB_001108ec:
    pfStack_4e8 = (fdb_doc *)0x1108f1;
    deleted_doc_get_api_test();
LAB_001108f1:
    pfStack_4e8 = (fdb_doc *)0x1108f6;
    deleted_doc_get_api_test();
LAB_001108f6:
    pfStack_4e8 = (fdb_doc *)0x1108fb;
    deleted_doc_get_api_test();
  }
  pfStack_4e8 = (fdb_doc *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pfStack_4f0 = pfVar4;
  pfStack_4e8 = unaff_R14;
  gettimeofday(&tStack_840,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fStack_8a8.deleted = false;
  fStack_8a8._73_3_ = 0;
  fStack_8a8.flags = 0;
  fStack_8a8.keylen = 0;
  fStack_8a8.metalen = 0;
  fStack_8a8.bodylen = 0;
  fStack_8a8.size_ondisk = 0;
  fStack_8a8.offset = 0;
  fStack_8a8.meta = (void *)0x0;
  fStack_8a8.key = acStack_6e8;
  fStack_8a8.body = &fStack_7e8;
  fStack_8a8.seqnum = 0xffffffffffffffff;
  pfVar4 = &fStack_5e8;
  fdb_get_default_config();
  fStack_5e8.purging_interval = 0;
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&pfStack_8c0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open(pfStack_8c0,&pfStack_8b8,"main",&fStack_858);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b41;
    acStack_6e8[0] = 'K';
    acStack_6e8[1] = '\0';
    pfVar4 = &fStack_7e8;
    fStack_7e8.chunksize = 0x6f62;
    fStack_7e8._2_2_ = 0x7964;
    fStack_7e8.blocksize._0_1_ = 0;
    sVar3 = strlen(acStack_6e8);
    fStack_8a8.keylen = sVar3 + 1;
    sVar3 = strlen((char *)pfVar4);
    fStack_8a8.bodylen = sVar3 + 1;
    fVar2 = fdb_set(pfStack_8b8,&fStack_8a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b46;
    fVar2 = fdb_del(pfStack_8b8,&fStack_8a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4b;
    pfVar4 = (fdb_config *)&pfStack_8b0;
    fdb_doc_create((fdb_doc **)pfVar4,fStack_8a8.key,fStack_8a8.keylen,(void *)0x0,0,(void *)0x0,0);
    fVar2 = fdb_get(pfStack_8b8,pfStack_8b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b50;
    fdb_doc_free(pfStack_8b0);
    fdb_get_file_info(pfStack_8c0,(fdb_file_info *)auStack_830);
    pfVar4 = (fdb_config *)(auStack_830 + 0x10);
    if (auStack_830._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_commit(pfStack_8c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b55;
    fdb_get_file_info(pfStack_8c0,(fdb_file_info *)auStack_830);
    if (auStack_830._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_kvs_close(pfStack_8b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5a;
    fVar2 = fdb_close(pfStack_8c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"deleted doc stat test");
      return;
    }
  }
  else {
    deleted_doc_stat_test();
LAB_00110b41:
    deleted_doc_stat_test();
LAB_00110b46:
    deleted_doc_stat_test();
LAB_00110b4b:
    deleted_doc_stat_test();
LAB_00110b50:
    deleted_doc_stat_test();
LAB_00110b55:
    deleted_doc_stat_test();
LAB_00110b5a:
    deleted_doc_stat_test();
  }
  deleted_doc_stat_test();
  pcStack_d58 = (code *)0x110b81;
  pfStack_8f8 = pfVar4;
  gettimeofday(&tStack_d28,(__timezone_ptr_t)0x0);
  pcStack_d58 = (code *)0x110b86;
  memleak_start();
  pcVar6 = acStack_a00;
  builtin_strncpy(acStack_a00,"./dummy1",9);
  pcStack_d58 = (code *)0x110bab;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_af8;
  pcStack_d58 = (code *)0x110bbb;
  fdb_get_default_config();
  fStack_af8.buffercache_size = 0;
  kvs_config = &fStack_d18.create_if_missing;
  pcStack_d58 = (code *)0x110bd0;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_d38;
  pcStack_d58 = (code *)0x110be3;
  fdb_open(ptr_fhandle,pcVar6,pfVar4);
  pcStack_d58 = (code *)0x110bfb;
  fVar2 = fdb_kvs_open(pfStack_d38,&pfStack_d40,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d95;
  unaff_RBP = 0;
  do {
    pcStack_d58 = (code *)0x110c2c;
    sprintf((char *)&fStack_c00,"key%05d",unaff_RBP);
    pcStack_d58 = (code *)0x110c3b;
    sprintf((char *)apfStack_d00,"value%05d",unaff_RBP);
    pfVar1 = pfStack_d40;
    pcStack_d58 = (code *)0x110c48;
    sVar3 = strlen((char *)&fStack_c00);
    pcVar6 = (char *)(sVar3 + 1);
    pcStack_d58 = (code *)0x110c54;
    sVar3 = strlen((char *)apfStack_d00);
    pcStack_d58 = (code *)0x110c69;
    fVar2 = fdb_set_kv(pfVar1,&fStack_c00,(size_t)pcVar6,apfStack_d00,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_d58 = (code *)0x110d90;
      complete_delete_test();
      goto LAB_00110d90;
    }
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_d58 = (code *)0x110c8a;
  fdb_commit(pfStack_d38,'\x01');
  pcVar6 = "key%05d";
  pfVar4 = &fStack_c00;
  kvs_config = "value%05d";
  ptr_fhandle = apfStack_d00;
  unaff_RBP = 0;
  do {
    pcStack_d58 = (code *)0x110cb6;
    sprintf((char *)pfVar4,"key%05d",unaff_RBP);
    pcStack_d58 = (code *)0x110cc5;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    pfVar1 = pfStack_d40;
    pcStack_d58 = (code *)0x110cd2;
    sVar3 = strlen((char *)pfVar4);
    pcStack_d58 = (code *)0x110ce1;
    fVar2 = fdb_del_kv(pfVar1,pfVar4,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d90;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_d58 = (code *)0x110d02;
  fdb_commit(pfStack_d38,'\x01');
  pcStack_d58 = (code *)0x110d22;
  fVar2 = fdb_iterator_init(pfStack_d40,&pfStack_d30,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9a;
  pcStack_d58 = (code *)0x110d30;
  fVar2 = fdb_iterator_close(pfStack_d30);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_d58 = (code *)0x110d3e;
    fdb_close(pfStack_d38);
    pcStack_d58 = (code *)0x110d43;
    fdb_shutdown();
    pcStack_d58 = (code *)0x110d48;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pcStack_d58 = (code *)0x110d79;
    fprintf(_stderr,pcVar6,"complete delete");
    return;
  }
  goto LAB_00110d9f;
LAB_00110d90:
  pfVar4 = &fStack_c00;
  ptr_fhandle = apfStack_d00;
  kvs_config = "value%05d";
  pcStack_d58 = (code *)0x110d95;
  complete_delete_test();
LAB_00110d95:
  pcStack_d58 = (code *)0x110d9a;
  complete_delete_test();
LAB_00110d9a:
  pcStack_d58 = (code *)0x110d9f;
  complete_delete_test();
LAB_00110d9f:
  pcStack_d58 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11d0 = (fdb_config *)0x110dc1;
  pcStack_d80 = pcVar6;
  ppfStack_d78 = ptr_fhandle;
  pfStack_d68 = pfVar4;
  pfStack_d60 = (fdb_kvs_config *)kvs_config;
  pcStack_d58 = (code *)unaff_RBP;
  gettimeofday(&tStack_1198,(__timezone_ptr_t)0x0);
  pfStack_11d0 = (fdb_config *)0x110dc6;
  memleak_start();
  pfStack_11d0 = (fdb_config *)0x110dd0;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_11d0 = (fdb_config *)0x110ddf;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_1080;
  pfStack_11d0 = (fdb_config *)0x110def;
  fdb_get_default_config();
  pfStack_11d0 = (fdb_config *)0x110df9;
  fdb_get_default_kvs_config();
  pfStack_11d0 = (fdb_config *)0x110e0d;
  fVar2 = fdb_open(&pfStack_11c0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11d0 = (fdb_config *)0x110e2b;
    fVar2 = fdb_kvs_open(pfStack_11c0,&pfStack_11b8,(char *)0x0,&fStack_11b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb0;
    pcVar6 = (char *)0x0;
    uVar7 = 0;
    do {
      pfStack_11d0 = (fdb_config *)0x110e54;
      sprintf(acStack_e88,"key%128d",uVar7 & 0xffffffff);
      pfStack_11d0 = (fdb_config *)0x110e70;
      sprintf(acStack_f88,"meta%128d",uVar7 & 0xffffffff);
      pfStack_11d0 = (fdb_config *)0x110e86;
      sprintf(acStack_1188,"body%128d",uVar7 & 0xffffffff);
      pfStack_11d0 = (fdb_config *)0x110e92;
      sVar3 = strlen(acStack_e88);
      pfStack_11d0 = (fdb_config *)0x110ea0;
      metalen = strlen(acStack_f88);
      pfStack_11d0 = (fdb_config *)0x110ead;
      bodylen = strlen(acStack_1188);
      pfStack_11d0 = (fdb_config *)0x110ed7;
      fdb_doc_create((fdb_doc **)(pcVar6 + (long)&__ptr->chunksize),acStack_e88,sVar3,acStack_f88,
                     metalen,acStack_1188,bodylen);
      pfStack_11d0 = (fdb_config *)0x110ee5;
      fdb_set(pfStack_11b8,*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      pfStack_11d0 = (fdb_config *)0x110eee;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 8;
    } while (uVar7 != 500000);
    pfStack_11d0 = (fdb_config *)0x110f0c;
    fVar2 = fdb_kvs_close(pfStack_11b8);
    pfVar4 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb5;
    pfStack_11d0 = (fdb_config *)0x110f1e;
    fVar2 = fdb_close(pfStack_11c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fba;
    pfStack_11d0 = (fdb_config *)0x110f3f;
    fVar2 = fdb_open(&pfStack_11c0,"./dummy1",&fStack_1080);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f56:
      pfStack_11d0 = (fdb_config *)0x110f5e;
      free(__ptr);
      pfStack_11d0 = (fdb_config *)0x110f63;
      fdb_shutdown();
      pfStack_11d0 = (fdb_config *)0x110f68;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_11d0 = (fdb_config *)0x110f99;
      fprintf(_stderr,pcVar6,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11d0 = (fdb_config *)0x110f52;
      fVar2 = fdb_close(pfStack_11c0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f56;
      goto LAB_00110fc4;
    }
  }
  else {
    pfStack_11d0 = (fdb_config *)0x110fb0;
    large_batch_write_no_commit_test();
LAB_00110fb0:
    pfStack_11d0 = (fdb_config *)0x110fb5;
    large_batch_write_no_commit_test();
LAB_00110fb5:
    pfStack_11d0 = (fdb_config *)0x110fba;
    large_batch_write_no_commit_test();
LAB_00110fba:
    pfStack_11d0 = (fdb_config *)0x110fbf;
    large_batch_write_no_commit_test();
  }
  pfStack_11d0 = (fdb_config *)0x110fc4;
  large_batch_write_no_commit_test();
LAB_00110fc4:
  pfStack_11d0 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11e0 = pcVar6;
  pfStack_11d8 = pfVar4;
  pfStack_11d0 = __ptr;
  gettimeofday(&tStack_1400,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_13d8.wal_threshold = 0x400;
  fStack_13d8.seqtree_opt = '\x01';
  fStack_13d8.purging_interval = 1;
  fStack_13d8.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_1408,"./dummy1",&fStack_13d8);
  fdb_kvs_open(pfStack_1408,&pfStack_1410,"db1",&fStack_13f0);
  sprintf(acStack_12e0,"key%d",0);
  sVar3 = strlen(acStack_12e0);
  fdb_doc_create(&pfStack_1418,acStack_12e0,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_1410,pfStack_1418);
  fVar2 = fdb_get(pfStack_1410,pfStack_1418);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_1410,pfStack_1418);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_1410,pfStack_1418);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_1410,pfStack_1418);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_1410,pfStack_1418);
        fVar2 = fdb_get(pfStack_1410,pfStack_1418);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_1418->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_1410,pfStack_1418);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_1418->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_1410,pfStack_1418);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_1418->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_1410,pfStack_1418);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_1418->deleted != false) {
                    fdb_doc_free(pfStack_1418);
                    fdb_kvs_close(pfStack_1410);
                    fdb_close(pfStack_1408);
                    fdb_shutdown();
                    memleak_end();
                    pcVar6 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar6 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar6,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void delete_reopen_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *fh;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.num_compactor_threads = 1;
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_kv(db, (void *) "foo", 3, (void *)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    void *value;
    size_t valueSize;
    status = fdb_get_kv(db, (void*)"foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CHK(valueSize == 5);
    TEST_CMP(value, "value", 5);
    fdb_free_block(value);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_del_kv(db, "foo", 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Reopen:
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("end trans delete & reopen passed");
}